

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPreData.cpp
# Opt level: O0

bool __thiscall HPreData::isZeroA(HPreData *this,int i,int j)

{
  bool bVar1;
  reference pvVar2;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int k;
  int local_1c;
  
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x150),(long)in_ESI);
  local_1c = *pvVar2;
  while( true ) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x168),(long)local_1c);
    bVar1 = false;
    if (in_EDX != *pvVar2) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x150),(long)(in_ESI + 1));
      bVar1 = local_1c < *pvVar2;
    }
    if (!bVar1) break;
    local_1c = local_1c + 1;
  }
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x150),(long)(in_ESI + 1));
  return local_1c == *pvVar2;
}

Assistant:

bool HPreData::isZeroA(int i, int j) {
	int k=ARstart[i];
    while (j != ARindex[k] && k<ARstart[i+1])
            k++;
    if (k==ARstart[i+1]) {
    	return true;
    	}
    return false;
}